

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O2

bool __thiscall
lzham::lzcompressor::optimal_parse(lzcompressor *this,parse_thread_state *parse_state)

{
  search_accelerator *dict;
  uint *puVar1;
  node *__s;
  vector<lzham::lzcompressor::lzdecision> *this_00;
  int iVar2;
  uint is_match_model_index;
  state *this_01;
  uchar *puVar3;
  undefined8 uVar4;
  node_state *pnVar5;
  uint uVar6;
  bool bVar7;
  uint lit_pred0;
  uint uVar8;
  uint uVar9;
  bit_cost_t bVar10;
  ulong uVar11;
  dict_match *pdVar12;
  uint16 *puVar13;
  lzdecision *plVar14;
  uint uVar15;
  uint uVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  lzdecision *plVar20;
  node *pnVar21;
  ulong uVar22;
  node *pnVar23;
  undefined2 uVar24;
  uint new_capacity;
  uint l;
  uint uVar25;
  uint uVar26;
  uint *lzdec;
  ulong uVar27;
  uint uVar28;
  long lVar29;
  uint local_cdc;
  ulong local_cd8;
  uint local_cc4;
  uint match_distances [128];
  uint match_lens [128];
  bit_cost_t lzdec_bitcosts [258];
  
  (parse_state->super_raw_parse_thread_state).m_failed = false;
  (parse_state->super_raw_parse_thread_state).m_emit_decisions_backwards = true;
  *(undefined2 *)
   ((long)&(parse_state->super_raw_parse_thread_state).m_nodes[0].m_node_states[0].m_total_cost + 4)
       = 0xffff;
  *(undefined8 *)
   ((parse_state->super_raw_parse_thread_state).m_nodes[0].m_node_states[0].m_saved_state.
    m_match_hist + 3) = 0;
  __s = (parse_state->super_raw_parse_thread_state).m_nodes;
  *(undefined4 *)
   &(parse_state->super_raw_parse_thread_state).m_nodes[0].m_node_states[0].m_total_cost = 0;
  this_01 = (parse_state->super_raw_parse_thread_state).m_pState;
  local_cdc = (parse_state->super_raw_parse_thread_state).m_start_ofs;
  uVar16 = (parse_state->super_raw_parse_thread_state).m_bytes_to_match;
  dict = &this->m_accel;
  local_cc4 = local_cdc - ((this->m_accel).m_max_dict_size_mask & (this->m_accel).m_lookahead_pos);
  puVar1 = (this_01->super_state_base).m_match_hist;
  uVar11 = 0;
  pnVar23 = __s;
  do {
    new_capacity = (uint)uVar11;
    uVar15 = uVar16 - new_capacity;
    if ((uVar16 < new_capacity || uVar15 == 0) ||
       ((lzdec = &__s->m_node_states[uVar11 - 1].m_total_complexity,
        (parse_state->super_raw_parse_thread_state).m_parse_early_out_thresh <= new_capacity &&
        ((node *)lzdec == pnVar23)))) {
      this_00 = &(parse_state->super_raw_parse_thread_state).m_best_decisions;
      bVar7 = vector<lzham::lzcompressor::lzdecision>::try_reserve(this_00,new_capacity);
      if (bVar7) {
        plVar14 = this_00->m_p;
        plVar20 = plVar14;
        do {
          lVar17 = (long)(int)uVar11;
          plVar20->m_dist =
               (parse_state->super_raw_parse_thread_state).m_nodes[0].m_node_states[lVar17].m_lzdec.
               m_pos;
          pnVar5 = __s->m_node_states + lVar17 + -1;
          uVar4._0_4_ = pnVar5->m_total_complexity;
          uVar4._4_2_ = pnVar5->m_parent_index;
          uVar4._6_1_ = pnVar5->m_parent_state_index;
          uVar4._7_1_ = pnVar5->field_0x37;
          plVar20->m_pos = (undefined4)uVar4;
          plVar20->m_len = (int)((ulong)uVar4 >> 0x20);
          plVar20 = plVar20 + 1;
          uVar16 = (uint)*(short *)((long)&(parse_state->super_raw_parse_thread_state).m_nodes[0].
                                           m_node_states[lVar17].m_total_cost + 4);
          uVar11 = (ulong)uVar16;
          plVar14 = plVar14 + 1;
        } while (0 < (int)uVar16);
        vector<lzham::lzcompressor::lzdecision>::try_resize_no_construct
                  (this_00,(uint)(((long)plVar14 -
                                  (long)(parse_state->super_raw_parse_thread_state).m_best_decisions
                                        .m_p) / 0xc),false);
        (parse_state->super_raw_parse_thread_state).m_bytes_actually_parsed = new_capacity;
      }
      else {
        (parse_state->super_raw_parse_thread_state).m_failed = true;
      }
      memset(__s,0xff,(long)pnVar23 + (0x38 - (long)__s));
      return bVar7;
    }
    uVar26 = 0x101;
    if (uVar15 < 0x101) {
      uVar26 = uVar15;
    }
    uVar9 = (this->m_accel).m_cur_dict_size;
    if (new_capacity != 0) {
      (this_01->super_state_base).m_cur_ofs = lzdec[3];
      (this_01->super_state_base).m_cur_state = lzdec[4];
      uVar4 = *(undefined8 *)(lzdec + 7);
      *(undefined8 *)puVar1 = *(undefined8 *)(lzdec + 5);
      *(undefined8 *)((this_01->super_state_base).m_match_hist + 2) = uVar4;
      state_base::partial_advance(&this_01->super_state_base,(lzdecision *)lzdec);
    }
    lVar17 = *(long *)(lzdec + 10);
    iVar2 = lzdec[0xc];
    uVar18 = 1;
    lit_pred0 = state::get_pred_char(this_01,dict,local_cdc,1);
    is_match_model_index = (this_01->super_state_base).m_cur_state;
    puVar3 = (this->m_accel).m_dict.m_p;
    lVar29 = 0;
    local_cd8 = 0;
    while( true ) {
      uVar24 = (undefined2)uVar11;
      if (lVar29 == 4) break;
      if (puVar1[lVar29] <= uVar9 + local_cc4) {
        for (uVar27 = 0; uVar26 != uVar27; uVar27 = uVar27 + 1) {
          if ((this->m_accel).m_dict.m_p
              [uVar27 + ((local_cc4 - puVar1[lVar29]) + (this->m_accel).m_lookahead_pos &
                        (this->m_accel).m_max_dict_size_mask)] != puVar3[uVar27 + local_cdc])
          goto LAB_0010a599;
        }
        uVar27 = (ulong)uVar26;
LAB_0010a599:
        uVar25 = (uint)uVar27;
        if ((uint)uVar18 <= uVar25) {
          uVar28 = (uint)lVar29;
          state::get_rep_match_costs
                    (this_01,local_cdc,lzdec_bitcosts,uVar28,(uint)uVar18,uVar25,
                     is_match_model_index);
          uVar8 = iVar2 + 2 + uVar28;
          pnVar21 = (node *)(lzdec + uVar18 * 0xe);
          for (; uVar18 <= (uVar27 & 0xffffffff); uVar18 = uVar18 + 1) {
            uVar22 = lzdec_bitcosts[uVar18] + lVar17;
            uVar19 = *(ulong *)((long)pnVar21->m_node_states[0].m_saved_state.m_match_hist + 0xc);
            if ((uVar22 <= uVar19) &&
               ((uVar22 != uVar19 || (uVar8 < (uint)pnVar21->m_node_states[0].m_total_cost)))) {
              *(ulong *)((long)pnVar21->m_node_states[0].m_saved_state.m_match_hist + 0xc) = uVar22;
              *(uint *)&pnVar21->m_node_states[0].m_total_cost = uVar8;
              *(undefined2 *)((long)&pnVar21->m_node_states[0].m_total_cost + 4) = uVar24;
              pnVar21->m_node_states[0].m_lzdec.m_len = (this_01->super_state_base).m_cur_ofs;
              pnVar21->m_node_states[0].m_lzdec.m_dist = (this_01->super_state_base).m_cur_state;
              uVar6 = puVar1[1];
              uVar4 = *(undefined8 *)((this_01->super_state_base).m_match_hist + 2);
              pnVar21->m_node_states[0].m_saved_state.m_cur_ofs = puVar1[0];
              pnVar21->m_node_states[0].m_saved_state.m_cur_state = uVar6;
              *(undefined8 *)pnVar21->m_node_states[0].m_saved_state.m_match_hist = uVar4;
              pnVar21->m_num_node_states = local_cdc;
              pnVar21->m_node_states[0].m_lzdec.m_pos = ~uVar28;
              *(int *)&pnVar21->field_0x4 = (int)uVar18;
              if (pnVar23 < pnVar21) {
                pnVar23 = pnVar21;
              }
            }
            pnVar21 = (node *)&pnVar21->m_node_states[0].m_total_complexity;
          }
          if (uVar25 < (uint)local_cd8) {
            uVar27 = local_cd8;
          }
          local_cd8 = uVar27 & 0xffffffff;
        }
      }
      uVar18 = 2;
      lVar29 = lVar29 + 1;
    }
    if ((uint)local_cd8 < this->m_fast_bytes) {
      uVar25 = (uint)local_cd8;
      if (1 < uVar15) {
        if (((uint)local_cd8 < 2) &&
           (uVar9 = search_accelerator::get_len2_match(dict,local_cc4), uVar9 != 0)) {
          bVar10 = state::get_len2_match_cost
                             (this_01,&this->super_CLZBase,local_cdc,uVar9,is_match_model_index);
          uVar11 = bVar10 + lVar17;
          if ((uVar11 < *(ulong *)(lzdec + 0x26)) ||
             ((uVar11 == *(ulong *)(lzdec + 0x26) && (iVar2 + 7U < lzdec[0x28])))) {
            *(ulong *)(lzdec + 0x26) = uVar11;
            lzdec[0x28] = iVar2 + 7U;
            *(undefined2 *)(lzdec + 0x29) = uVar24;
            lzdec[0x1f] = (this_01->super_state_base).m_cur_ofs;
            lzdec[0x20] = (this_01->super_state_base).m_cur_state;
            uVar4 = *(undefined8 *)((this_01->super_state_base).m_match_hist + 2);
            *(undefined8 *)(lzdec + 0x21) = *(undefined8 *)puVar1;
            *(undefined8 *)(lzdec + 0x23) = uVar4;
            lzdec[0x1c] = local_cdc;
            lzdec[0x1d] = 2;
            lzdec[0x1e] = uVar9;
            if (pnVar23 < lzdec + 0x1c) {
              pnVar23 = (node *)(lzdec + 0x1c);
            }
          }
          local_cd8 = 2;
        }
        pdVar12 = search_accelerator::find_matches(dict,local_cc4,true);
        uVar25 = (uint)local_cd8;
        if (pdVar12 != (dict_match *)0x0) {
          puVar13 = &pdVar12->m_len;
          uVar15 = 0;
          uVar11 = local_cd8;
          do {
            uVar25 = *puVar13 + 2;
            if (uVar26 <= *puVar13 + 2) {
              uVar25 = uVar26;
            }
            uVar8 = ((dict_match *)(puVar13 + -2))->m_dist;
            if ((uint)uVar11 < uVar25) {
              match_lens[uVar15] = uVar25;
              match_distances[uVar15] = uVar8 & 0x7fffffff;
              uVar15 = uVar15 + 1;
              uVar11 = (ulong)uVar25;
            }
            puVar13 = puVar13 + 3;
          } while (-1 < (int)uVar8);
          uVar25 = (uint)uVar11;
          if (uVar15 != 0) {
            local_cd8._0_4_ = (uint)local_cd8 + ((uint)local_cd8 == 0);
            for (uVar18 = 0; uVar18 != uVar15; uVar18 = uVar18 + 1) {
              uVar26 = (uint)local_cd8 + 1;
              local_cd8._0_4_ = match_lens[uVar18];
              uVar9 = match_distances[uVar18];
              state::get_full_match_costs
                        (this_01,&this->super_CLZBase,local_cdc,lzdec_bitcosts,uVar9,uVar26,
                         (uint)local_cd8,is_match_model_index);
              for (; uVar26 <= (uint)local_cd8; uVar26 = uVar26 + 1) {
                uVar27 = (ulong)uVar26;
                pnVar21 = (node *)(lzdec + uVar27 * 0xe);
                uVar19 = lzdec_bitcosts[uVar27] + lVar17;
                uVar8 = (uVar26 < 9) + 6 + iVar2;
                if ((uVar19 <= *(ulong *)(lzdec + uVar27 * 0xe + 10)) &&
                   ((uVar19 != *(ulong *)(lzdec + uVar27 * 0xe + 10) ||
                    (uVar8 < (uint)pnVar21->m_node_states[0].m_total_cost)))) {
                  *(ulong *)((long)pnVar21->m_node_states[0].m_saved_state.m_match_hist + 0xc) =
                       uVar19;
                  *(uint *)&pnVar21->m_node_states[0].m_total_cost = uVar8;
                  *(undefined2 *)((long)&pnVar21->m_node_states[0].m_total_cost + 4) = uVar24;
                  pnVar21->m_node_states[0].m_lzdec.m_len = (this_01->super_state_base).m_cur_ofs;
                  pnVar21->m_node_states[0].m_lzdec.m_dist = (this_01->super_state_base).m_cur_state
                  ;
                  uVar28 = puVar1[1];
                  uVar4 = *(undefined8 *)((this_01->super_state_base).m_match_hist + 2);
                  pnVar21->m_node_states[0].m_saved_state.m_cur_ofs = puVar1[0];
                  pnVar21->m_node_states[0].m_saved_state.m_cur_state = uVar28;
                  *(undefined8 *)pnVar21->m_node_states[0].m_saved_state.m_match_hist = uVar4;
                  pnVar21->m_num_node_states = local_cdc;
                  *(uint *)&pnVar21->field_0x4 = uVar26;
                  pnVar21->m_node_states[0].m_lzdec.m_pos = uVar9;
                  if (pnVar23 < pnVar21) {
                    pnVar23 = pnVar21;
                  }
                }
              }
            }
          }
        }
      }
      local_cd8._0_4_ = uVar25;
      if ((uint)local_cd8 < this->m_fast_bytes) {
        bVar10 = state::get_lit_cost(this_01,&this->super_CLZBase,dict,local_cdc,lit_pred0,
                                     is_match_model_index);
        uVar11 = bVar10 + lVar17;
        if ((uVar11 < *(ulong *)(lzdec + 0x18)) ||
           ((uVar11 == *(ulong *)(lzdec + 0x18) && (iVar2 + 1U < lzdec[0x1a])))) {
          *(ulong *)(lzdec + 0x18) = uVar11;
          lzdec[0x1a] = iVar2 + 1U;
          *(undefined2 *)(lzdec + 0x1b) = uVar24;
          lzdec[0x11] = (this_01->super_state_base).m_cur_ofs;
          lzdec[0x12] = (this_01->super_state_base).m_cur_state;
          uVar4 = *(undefined8 *)((this_01->super_state_base).m_match_hist + 2);
          *(undefined8 *)(lzdec + 0x13) = *(undefined8 *)puVar1;
          *(undefined8 *)(lzdec + 0x15) = uVar4;
          lzdec[0xe] = local_cdc;
          *(undefined8 *)(lzdec + 0xf) = 0;
          if (pnVar23 < lzdec + 0xe) {
            pnVar23 = (node *)(lzdec + 0xe);
          }
        }
        local_cd8._0_4_ = 1;
      }
    }
    local_cdc = local_cdc + (uint)local_cd8;
    local_cc4 = local_cc4 + (uint)local_cd8;
    uVar11 = (ulong)(new_capacity + (uint)local_cd8);
  } while( true );
}

Assistant:

bool lzcompressor::optimal_parse(parse_thread_state &parse_state)
   {
      LZHAM_ASSERT(parse_state.m_bytes_to_match <= cMaxParseGraphNodes);

      parse_state.m_failed = false;
      parse_state.m_emit_decisions_backwards = true;

      node_state *pNodes = reinterpret_cast<node_state*>(parse_state.m_nodes);
      pNodes[0].m_parent_index = -1;
      pNodes[0].m_total_cost = 0;
      pNodes[0].m_total_complexity = 0;

#ifdef LZHAM_BUILD_DEBUG
      for (uint i = 1; i < (cMaxParseGraphNodes + 1); i++)
      {
         LZHAM_ASSERT(pNodes[i].m_total_cost == cUINT64_MAX);
         LZHAM_ASSERT(pNodes[i].m_total_complexity == UINT_MAX);
         LZHAM_ASSERT(pNodes[i].m_parent_index == -1);
      }
#endif

      state &approx_state = *parse_state.m_pState;

      const uint bytes_to_parse = parse_state.m_bytes_to_match;

      const uint lookahead_start_ofs = m_accel.get_lookahead_pos() & m_accel.get_max_dict_size_mask();

      uint cur_dict_ofs = parse_state.m_start_ofs;
      uint cur_lookahead_ofs = cur_dict_ofs - lookahead_start_ofs;
      uint cur_node_index = 0;

      enum { cMaxFullMatches = cMatchAccelMaxSupportedProbes };
      uint match_lens[cMaxFullMatches];
      uint match_distances[cMaxFullMatches];

      bit_cost_t lzdec_bitcosts[cMaxMatchLen + 1];

      node_state *pMax_node_in_graph = &pNodes[0];

      while (cur_node_index < bytes_to_parse)
      {
         node_state* pCur_node = &pNodes[cur_node_index];

         if ((cur_node_index >= parse_state.m_parse_early_out_thresh) && (pCur_node == pMax_node_in_graph))
         {
            // If the best path *must* pass through this node, and we're far enough along, and we're parsing using a single thread, then exit so we can move all our state forward.
            break;
         }

         const uint max_admissable_match_len = LZHAM_MIN(static_cast<uint>(CLZBase::cMaxMatchLen), bytes_to_parse - cur_node_index);
         const uint find_dict_size = m_accel.m_cur_dict_size + cur_lookahead_ofs;

         if (cur_node_index)
         {
            LZHAM_ASSERT(pCur_node->m_parent_index >= 0);

            // Move to this node's state using the lowest cost LZ decision found.
            approx_state.restore_partial_state(pCur_node->m_saved_state);
            approx_state.partial_advance(pCur_node->m_lzdec);
         }

         const bit_cost_t cur_node_total_cost = pCur_node->m_total_cost;
         // This assert includes a fudge factor - make sure we don't overflow our scaled costs.
         LZHAM_ASSERT((cBitCostMax - cur_node_total_cost) > (cBitCostScale * 64));
         const uint cur_node_total_complexity = pCur_node->m_total_complexity;

         const uint lit_pred0 = approx_state.get_pred_char(m_accel, cur_dict_ofs, 1);
         uint is_match_model_index = LZHAM_IS_MATCH_MODEL_INDEX(approx_state.m_cur_state);

         const uint8* pLookahead = &m_accel.m_dict[cur_dict_ofs];

         // rep matches
         uint match_hist_max_len = 0;
         uint match_hist_min_match_len = 1;
         for (uint rep_match_index = 0; rep_match_index < cMatchHistSize; rep_match_index++)
         {
            uint hist_match_len = 0;

            uint dist = approx_state.m_match_hist[rep_match_index];
            if (dist <= find_dict_size)
            {
               const uint comp_pos = static_cast<uint>((m_accel.m_lookahead_pos + cur_lookahead_ofs - dist) & m_accel.m_max_dict_size_mask);
               const uint8* pComp = &m_accel.m_dict[comp_pos];

               for (hist_match_len = 0; hist_match_len < max_admissable_match_len; hist_match_len++)
                  if (pComp[hist_match_len] != pLookahead[hist_match_len])
                     break;
            }

            if (hist_match_len >= match_hist_min_match_len)
            {
               match_hist_max_len = math::maximum(match_hist_max_len, hist_match_len);

               approx_state.get_rep_match_costs(cur_dict_ofs, lzdec_bitcosts, rep_match_index, match_hist_min_match_len, hist_match_len, is_match_model_index);

               uint rep_match_total_complexity = cur_node_total_complexity + (cRep0Complexity + rep_match_index);
               for (uint l = match_hist_min_match_len; l <= hist_match_len; l++)
               {
#if LZHAM_VERIFY_MATCH_COSTS
                  {
                     lzdecision actual_dec(cur_dict_ofs, l, -((int)rep_match_index + 1));
                     bit_cost_t actual_cost = approx_state.get_cost(*this, m_accel, actual_dec);
                     LZHAM_ASSERT(actual_cost == lzdec_bitcosts[l]);
                  }
#endif
                  node_state& dst_node = pCur_node[l];

                  bit_cost_t rep_match_total_cost = cur_node_total_cost + lzdec_bitcosts[l];

                  if ((rep_match_total_cost > dst_node.m_total_cost) || ((rep_match_total_cost == dst_node.m_total_cost) && (rep_match_total_complexity >= dst_node.m_total_complexity)))
                     continue;

                  dst_node.m_total_cost = rep_match_total_cost;
                  dst_node.m_total_complexity = rep_match_total_complexity;
                  dst_node.m_parent_index = (uint16)cur_node_index;
                  approx_state.save_partial_state(dst_node.m_saved_state);
                  dst_node.m_lzdec.init(cur_dict_ofs, l, -((int)rep_match_index + 1));
                  dst_node.m_lzdec.m_len = l;

                  pMax_node_in_graph = LZHAM_MAX(pMax_node_in_graph, &dst_node);
               }
            }

            match_hist_min_match_len = CLZBase::cMinMatchLen;
         }

         uint max_match_len = match_hist_max_len;

         if (max_match_len >= m_fast_bytes)
         {
            cur_dict_ofs += max_match_len;
            cur_lookahead_ofs += max_match_len;
            cur_node_index += max_match_len;
            continue;
         }

         // full matches
         if (max_admissable_match_len >= CLZBase::cMinMatchLen)
         {
            uint num_full_matches = 0;

            if (match_hist_max_len < 2)
            {
               // Get the nearest len2 match if we didn't find a rep len2.
               uint len2_match_dist = m_accel.get_len2_match(cur_lookahead_ofs);
               if (len2_match_dist)
               {
                  bit_cost_t cost = approx_state.get_len2_match_cost(*this, cur_dict_ofs, len2_match_dist, is_match_model_index);

#if LZHAM_VERIFY_MATCH_COSTS
                  {
                     lzdecision actual_dec(cur_dict_ofs, 2, len2_match_dist);
                     bit_cost_t actual_cost = approx_state.get_cost(*this, m_accel, actual_dec);
                     LZHAM_ASSERT(actual_cost == cost);
                  }
#endif

                  node_state& dst_node = pCur_node[2];

                  bit_cost_t match_total_cost = cur_node_total_cost + cost;
                  uint match_total_complexity = cur_node_total_complexity + cShortMatchComplexity;

                  if ((match_total_cost < dst_node.m_total_cost) || ((match_total_cost == dst_node.m_total_cost) && (match_total_complexity < dst_node.m_total_complexity)))
                  {
                     dst_node.m_total_cost = match_total_cost;
                     dst_node.m_total_complexity = match_total_complexity;
                     dst_node.m_parent_index = (uint16)cur_node_index;
                     approx_state.save_partial_state(dst_node.m_saved_state);
                     dst_node.m_lzdec.init(cur_dict_ofs, 2, len2_match_dist);

                     pMax_node_in_graph = LZHAM_MAX(pMax_node_in_graph, &dst_node);
                  }

                  max_match_len = 2;
               }
            }

            const uint min_truncate_match_len = max_match_len;

            // Now get all full matches: the nearest matches at each match length. (Actually, we don't
            // always get the nearest match. The match finder favors those matches which have the lowest value
            // in the nibble of each match distance, all other things being equal, to help exploit how the lowest
            // nibble of match distances is separately coded.)
            const dict_match* pMatches = m_accel.find_matches(cur_lookahead_ofs);
            if (pMatches)
            {
               for ( ; ; )
               {
                  uint match_len = pMatches->get_len();
                  LZHAM_ASSERT((pMatches->get_dist() > 0) && (pMatches->get_dist() <= m_dict_size));
                  match_len = LZHAM_MIN(match_len, max_admissable_match_len);

                  if (match_len > max_match_len)
                  {
                     max_match_len = match_len;

                     match_lens[num_full_matches] = match_len;
                     match_distances[num_full_matches] = pMatches->get_dist();
                     num_full_matches++;
                  }

                  if (pMatches->is_last())
                     break;
                  pMatches++;
               }
            }

            if (num_full_matches)
            {
               uint prev_max_match_len = LZHAM_MAX(1, min_truncate_match_len);
               for (uint full_match_index = 0; full_match_index < num_full_matches; full_match_index++)
               {
                  uint start_len = prev_max_match_len + 1;
                  uint end_len = match_lens[full_match_index];
                  uint match_dist = match_distances[full_match_index];

                  LZHAM_ASSERT(start_len <= end_len);

                  approx_state.get_full_match_costs(*this, cur_dict_ofs, lzdec_bitcosts, match_dist, start_len, end_len, is_match_model_index);

                  for (uint l = start_len; l <= end_len; l++)
                  {
                     uint match_complexity = (l >= cLongMatchComplexityLenThresh) ? cLongMatchComplexity : cShortMatchComplexity;

#if LZHAM_VERIFY_MATCH_COSTS
                     {
                        lzdecision actual_dec(cur_dict_ofs, l, match_dist);
                        bit_cost_t actual_cost = approx_state.get_cost(*this, m_accel, actual_dec);
                        LZHAM_ASSERT(actual_cost == lzdec_bitcosts[l]);
                     }
#endif
                     node_state& dst_node = pCur_node[l];

                     bit_cost_t match_total_cost = cur_node_total_cost + lzdec_bitcosts[l];
                     uint match_total_complexity = cur_node_total_complexity + match_complexity;

                     if ((match_total_cost > dst_node.m_total_cost) || ((match_total_cost == dst_node.m_total_cost) && (match_total_complexity >= dst_node.m_total_complexity)))
                        continue;

                     dst_node.m_total_cost = match_total_cost;
                     dst_node.m_total_complexity = match_total_complexity;
                     dst_node.m_parent_index = (uint16)cur_node_index;
                     approx_state.save_partial_state(dst_node.m_saved_state);
                     dst_node.m_lzdec.init(cur_dict_ofs, l, match_dist);

                     pMax_node_in_graph = LZHAM_MAX(pMax_node_in_graph, &dst_node);
                  }

                  prev_max_match_len = end_len;
               }
            }
         }

         if (max_match_len >= m_fast_bytes)
         {
            cur_dict_ofs += max_match_len;
            cur_lookahead_ofs += max_match_len;
            cur_node_index += max_match_len;
            continue;
         }

         // literal
         bit_cost_t lit_cost = approx_state.get_lit_cost(*this, m_accel, cur_dict_ofs, lit_pred0, is_match_model_index);
         bit_cost_t lit_total_cost = cur_node_total_cost + lit_cost;
         uint lit_total_complexity = cur_node_total_complexity + cLitComplexity;
#if LZHAM_VERIFY_MATCH_COSTS
         {
            lzdecision actual_dec(cur_dict_ofs, 0, 0);
            bit_cost_t actual_cost = approx_state.get_cost(*this, m_accel, actual_dec);
            LZHAM_ASSERT(actual_cost == lit_cost);
         }
#endif
         if ((lit_total_cost < pCur_node[1].m_total_cost) || ((lit_total_cost == pCur_node[1].m_total_cost) && (lit_total_complexity < pCur_node[1].m_total_complexity)))
         {
            pCur_node[1].m_total_cost = lit_total_cost;
            pCur_node[1].m_total_complexity = lit_total_complexity;
            pCur_node[1].m_parent_index = (int16)cur_node_index;
            approx_state.save_partial_state(pCur_node[1].m_saved_state);
            pCur_node[1].m_lzdec.init(cur_dict_ofs, 0, 0);

            pMax_node_in_graph = LZHAM_MAX(pMax_node_in_graph, &pCur_node[1]);
         }

         cur_dict_ofs++;
         cur_lookahead_ofs++;
         cur_node_index++;

      } // graph search

      LZHAM_ASSERT(static_cast<int>(cur_node_index) == (pMax_node_in_graph - pNodes));
      uint bytes_actually_parsed = cur_node_index;

      // Now get the optimal decisions by starting from the goal node.
      // m_best_decisions is filled backwards.
      if (!parse_state.m_best_decisions.try_reserve(bytes_actually_parsed))
      {
         parse_state.m_failed = true;

         memset(pNodes, 0xFF, (pMax_node_in_graph - pNodes + 1) * sizeof(node_state));

         LZHAM_LOG_ERROR(7037);

         return false;
      }

      int node_index = bytes_actually_parsed;
      lzdecision *pDst_dec = parse_state.m_best_decisions.get_ptr();
      do
      {
         LZHAM_ASSERT((node_index >= 0) && (node_index <= (int)cMaxParseGraphNodes));
         node_state& cur_node = pNodes[node_index];

         *pDst_dec++ = cur_node.m_lzdec;

         node_index = cur_node.m_parent_index;

      } while (node_index > 0);

      parse_state.m_best_decisions.try_resize_no_construct(static_cast<uint>(pDst_dec - parse_state.m_best_decisions.get_ptr()));

      parse_state.m_bytes_actually_parsed = bytes_actually_parsed;

      memset(pNodes, 0xFF, (pMax_node_in_graph - pNodes + 1) * sizeof(node_state));

      return true;
   }